

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

wstring * __thiscall
PDA::Transducer::Generator::add_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,int source,Register *dest,wchar_t suff)

{
  wstring *pwVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,L"add",L"",dest,CONCAT44(in_register_00000084,suff));
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_70,vswprintf,0x10,L"%d",(ulong)this & 0xffffffff);
  pwVar1 = (wstring *)std::__cxx11::wstring::insert((ulong)&local_70,0,L'\x01');
  std::__cxx11::wstring::wstring((wstring *)local_50,pwVar1);
  std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  Register::toString_abi_cxx11_(&local_70,(Register *)CONCAT44(in_register_00000014,source));
  pwVar1 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_70,0,(wchar_t *)0x0,0x138330);
  std::__cxx11::wstring::wstring((wstring *)local_50,pwVar1);
  std::__cxx11::wstring::_M_append((wchar_t *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::add(const int source, const Register &dest, const wchar_t suff)
{
    std::wstring result = L"add";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += L'$' + std::to_wstring(source);
    result += L",\t" + dest.toString();
    return result;
}